

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::updateActions(QMdiSubWindowPrivate *this)

{
  long lVar1;
  bool bVar2;
  Int IVar3;
  QFlagsStorage<Qt::WindowType> QVar4;
  QFlagsStorage<Qt::WindowType> QVar5;
  Int IVar6;
  QFlagsStorage<Qt::WindowType> action;
  QFlagsStorage<Qt::WindowType> QVar7;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  WindowFlags windowFlags;
  WindowType other;
  enum_type in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  enum_type f1;
  QFlagsStorage<Qt::WindowType> other_00;
  QMdiSubWindowPrivate *pQVar8;
  QFlagsStorageHelper<Qt::WindowType,_4> local_20;
  QFlagsStorageHelper<Qt::WindowType,_4> local_1c;
  QFlags local_18 [3];
  undefined1 visible;
  WindowStateAction in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = in_RDI;
  q_func(in_RDI);
  QVar4.i = (Int)QWidget::windowFlags
                           ((QWidget *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                           );
  for (f1 = Widget; IVar3 = _local_18, other_00.i = (Int)pQVar8, (int)f1 < 7; f1 = f1 + Window) {
    visible = (undefined1)(_local_18 >> 0x18);
    setVisible((QMdiSubWindowPrivate *)CONCAT44(QVar4.i,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffec,(bool)visible);
    _local_18 = IVar3;
  }
  other = (WindowType)((ulong)in_RDI >> 0x20);
  QVar5.i = (Int)QFlags<Qt::WindowType>::operator&
                           ((QFlags<Qt::WindowType> *)CONCAT44(f1,in_stack_ffffffffffffffd0),other);
  IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xfffffffffffffff0);
  IVar3 = _local_18;
  if (IVar6 == 0) {
    visible = (undefined1)(_local_18 >> 0x18);
    setVisible((QMdiSubWindowPrivate *)CONCAT44(QVar4.i,QVar5.i),in_stack_ffffffffffffffec,
               (bool)visible);
    _local_18 = IVar3;
    visible = (undefined1)(_local_18 >> 0x18);
    setVisible((QMdiSubWindowPrivate *)CONCAT44(QVar4.i,QVar5.i),in_stack_ffffffffffffffec,
               (bool)visible);
    setVisible((QMdiSubWindowPrivate *)CONCAT44(QVar4.i,QVar5.i),in_stack_ffffffffffffffec,
               (bool)visible);
    action.i = (Int)QFlags<Qt::WindowType>::operator&
                              ((QFlags<Qt::WindowType> *)CONCAT44(f1,in_stack_ffffffffffffffd0),
                               other);
    IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffec);
    if (IVar6 != 0) {
      setVisible((QMdiSubWindowPrivate *)CONCAT44(QVar4.i,QVar5.i),action.i,(bool)visible);
    }
    QVar7.i = (Int)Qt::operator|(f1,in_stack_ffffffffffffffd0);
    _local_18 = (Int)QFlags<Qt::WindowType>::operator&
                               ((QFlags<Qt::WindowType> *)CONCAT44(f1,QVar7.i),other_00.i);
    IVar6 = ::QFlags::operator_cast_to_unsigned_int(local_18);
    if (IVar6 != 0) {
      setVisible((QMdiSubWindowPrivate *)CONCAT44(QVar4.i,QVar5.i),action.i,(bool)visible);
    }
    local_1c.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&((QFlags<Qt::WindowType> *)CONCAT44(f1,QVar7.i),other);
    IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
    IVar3 = _local_18;
    if (IVar6 != 0) {
      visible = (undefined1)(_local_18 >> 0x18);
      bVar2 = (bool)visible;
      _local_18 = IVar3;
      setVisible((QMdiSubWindowPrivate *)CONCAT44(QVar4.i,QVar5.i),action.i,bVar2);
    }
    local_20.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&((QFlags<Qt::WindowType> *)CONCAT44(f1,QVar7.i),other);
    IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
    IVar3 = _local_18;
    if (IVar6 != 0) {
      visible = (undefined1)(_local_18 >> 0x18);
      bVar2 = (bool)visible;
      _local_18 = IVar3;
      setVisible((QMdiSubWindowPrivate *)CONCAT44(QVar4.i,QVar5.i),action.i,bVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::updateActions()
{
    Qt::WindowFlags windowFlags = q_func()->windowFlags();
    // Hide all
    for (int i = 0; i < NumWindowStateActions; ++i)
        setVisible(WindowStateAction(i), false);

#if defined(Q_OS_MACOS) && QT_CONFIG(action)
    if (q_func()->style()->inherits("QMacStyle"))
        for (int i = 0; i < NumWindowStateActions; ++i)
            if (QAction *action = actions[i])
                action->setIconVisibleInMenu(false);
#endif

    if (windowFlags & Qt::FramelessWindowHint)
        return;

    setVisible(StayOnTopAction, true);
    setVisible(MoveAction, moveEnabled);
    setVisible(ResizeAction, resizeEnabled);

    // CloseAction
    if (windowFlags & Qt::WindowSystemMenuHint)
        setVisible(CloseAction, true);

    // RestoreAction
    if (windowFlags & (Qt::WindowMinimizeButtonHint | Qt::WindowMaximizeButtonHint))
        setVisible(RestoreAction, true);

    // MinimizeAction
    if (windowFlags & Qt::WindowMinimizeButtonHint)
        setVisible(MinimizeAction, true);

    // MaximizeAction
    if (windowFlags & Qt::WindowMaximizeButtonHint)
        setVisible(MaximizeAction, true);
}